

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Request * __thiscall
kj::anon_unknown_36::NetworkHttpClient::request
          (Request *__return_storage_ptr__,NetworkHttpClient *this,HttpMethod method,StringPtr url,
          HttpHeaders *headers,Maybe<unsigned_long> expectedBodySize)

{
  HttpClient *pHVar1;
  int __flags;
  void *__child_stack;
  void *__arg;
  size_t sVar2;
  StringPtr url_00;
  StringPtr value;
  String path;
  char local_178 [8];
  undefined8 local_170;
  HttpHeaders headersCopy;
  Url parsed;
  
  __flags = 1;
  __arg = (void *)0x100;
  url_00.content.size_ = 1;
  url_00.content.ptr = (char *)url.content.size_;
  Url::parse(&parsed,(Url *)url.content.ptr,url_00,0x100,SUB82(headers,0));
  Url::toString(&path,&parsed,HTTP_REQUEST);
  HttpHeaders::clone(&headersCopy,(__fn *)headers,__child_stack,__flags,__arg);
  if (parsed.host.content.size_ == 0) {
    parsed.host.content.ptr = "";
  }
  sVar2 = parsed.host.content.size_ + (parsed.host.content.size_ == 0);
  value.content.size_ = sVar2;
  value.content.ptr = parsed.host.content.ptr;
  requireValidHeaderValue(value);
  headersCopy.indexedHeaders.ptr[0xb].content.ptr = parsed.host.content.ptr;
  headersCopy.indexedHeaders.ptr[0xb].content.size_ = sVar2;
  pHVar1 = getClient(this,&parsed);
  if (path.content.size_ == 0) {
    path.content.ptr = "";
  }
  local_178[0] = *(char *)expectedBodySize.ptr._0_8_;
  if (local_178[0] == '\x01') {
    local_170 = *(undefined8 *)(expectedBodySize.ptr._0_8_ + 8);
  }
  (**pHVar1->_vptr_HttpClient)
            (__return_storage_ptr__,pHVar1,(ulong)method,path.content.ptr,
             path.content.size_ + (path.content.size_ == 0),&headersCopy,local_178);
  HttpHeaders::~HttpHeaders(&headersCopy);
  Array<char>::~Array(&path.content);
  Url::~Url(&parsed);
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
    // We need to parse the proxy-style URL to convert it to host-style.
    // Use URL parsing options that avoid unnecessary rewrites.
    Url::Options urlOptions;
    urlOptions.allowEmpty = true;
    urlOptions.percentDecode = false;

    auto parsed = Url::parse(url, Url::HTTP_PROXY_REQUEST, urlOptions);
    auto path = parsed.toString(Url::HTTP_REQUEST);
    auto headersCopy = headers.clone();
    headersCopy.set(HttpHeaderId::HOST, parsed.host);
    return getClient(parsed).request(method, path, headersCopy, expectedBodySize);
  }